

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLChTranscoder.cpp
# Opt level: O0

XMLSize_t __thiscall
xercesc_4_0::XMLChTranscoder::transcodeTo
          (XMLChTranscoder *this,XMLCh *srcData,XMLSize_t srcCount,XMLByte *toFill,
          XMLSize_t maxBytes,XMLSize_t *charsEaten,UnRepOpts param_6)

{
  ulong local_50;
  XMLSize_t countToDo;
  XMLSize_t maxOutChars;
  XMLSize_t *charsEaten_local;
  XMLSize_t maxBytes_local;
  XMLByte *toFill_local;
  XMLSize_t srcCount_local;
  XMLCh *srcData_local;
  XMLChTranscoder *this_local;
  
  local_50 = srcCount;
  if (maxBytes >> 1 < srcCount) {
    local_50 = maxBytes >> 1;
  }
  memcpy(toFill,srcData,local_50 << 1);
  *charsEaten = local_50;
  return local_50 << 1;
}

Assistant:

XMLSize_t
XMLChTranscoder::transcodeTo(const  XMLCh* const    srcData
                            , const XMLSize_t       srcCount
                            ,       XMLByte* const  toFill
                            , const XMLSize_t       maxBytes
                            ,       XMLSize_t&      charsEaten
                                , const UnRepOpts)
{
    //
    //  Calculate the max chars we can do here. Its the lesser of the
    //  max chars we can store in the output byte buffer, and the number
    //  of chars in the source.
    //
    const XMLSize_t maxOutChars  = maxBytes / sizeof(XMLCh);
    const XMLSize_t countToDo    = maxOutChars < srcCount
                                    ? maxOutChars : srcCount;

    //
    //  Copy over the number of chars we calculated. Note that we have
    //  to convert the char count to a byte count!!
    //
    memcpy(toFill, srcData, countToDo * sizeof(XMLCh));

    // Set the chars eaten
    charsEaten = countToDo;

    // Return the bytes we transcoded
    return countToDo * sizeof(XMLCh);
}